

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O2

DecodeRawTransactionResponseStruct * __thiscall
cfd::js::api::json::DecodeRawTransactionResponse::ConvertToStruct
          (DecodeRawTransactionResponseStruct *__return_storage_ptr__,
          DecodeRawTransactionResponse *this)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  vector<cfd::js::api::DecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxInStruct>_>
  local_30;
  
  DecodeRawTransactionResponseStruct::DecodeRawTransactionResponseStruct(__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->hash);
  uVar1 = this->size_;
  uVar2 = this->vsize_;
  uVar3 = this->weight_;
  __return_storage_ptr__->version = this->version_;
  __return_storage_ptr__->size = uVar1;
  __return_storage_ptr__->vsize = uVar2;
  __return_storage_ptr__->weight = uVar3;
  __return_storage_ptr__->locktime = this->locktime_;
  core::
  JsonObjectVector<cfd::js::api::json::DecodeRawTransactionTxIn,_cfd::js::api::DecodeRawTransactionTxInStruct>
  ::ConvertToStruct(&local_30,&this->vin_);
  std::
  vector<cfd::js::api::DecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxInStruct>_>
  ::_M_move_assign(&__return_storage_ptr__->vin,&local_30);
  std::
  vector<cfd::js::api::DecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxInStruct>_>
  ::~vector(&local_30);
  core::
  JsonObjectVector<cfd::js::api::json::DecodeRawTransactionTxOut,_cfd::js::api::DecodeRawTransactionTxOutStruct>
  ::ConvertToStruct((vector<cfd::js::api::DecodeRawTransactionTxOutStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxOutStruct>_>
                     *)&local_30,&this->vout_);
  std::
  vector<cfd::js::api::DecodeRawTransactionTxOutStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxOutStruct>_>
  ::_M_move_assign(&__return_storage_ptr__->vout,&local_30);
  std::
  vector<cfd::js::api::DecodeRawTransactionTxOutStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxOutStruct>_>
  ::~vector((vector<cfd::js::api::DecodeRawTransactionTxOutStruct,_std::allocator<cfd::js::api::DecodeRawTransactionTxOutStruct>_>
             *)&local_30);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

DecodeRawTransactionResponseStruct DecodeRawTransactionResponse::ConvertToStruct() const {  // NOLINT
  DecodeRawTransactionResponseStruct result;
  result.txid = txid_;
  result.hash = hash_;
  result.version = version_;
  result.size = size_;
  result.vsize = vsize_;
  result.weight = weight_;
  result.locktime = locktime_;
  result.vin = vin_.ConvertToStruct();
  result.vout = vout_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}